

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O1

void __thiscall DTextEnterMenu::Drawer(DTextEnterMenu *this)

{
  int iVar1;
  int iVar2;
  FFont *font;
  DFrameBuffer *pDVar3;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  FRemapTable *pFVar7;
  int iVar8;
  EColorRange range;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  BYTE *string;
  int x;
  ulong uVar15;
  int width;
  int local_84;
  DFrameBuffer *local_80;
  DTextEnterMenu *local_78;
  long local_70;
  ulong local_68;
  uint local_5c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  long local_48;
  double local_40;
  ulong local_38;
  
  (*(((this->super_DMenu).mParentMenu.field_0.p)->super_DObject)._vptr_DObject[10])();
  iVar2 = CleanYfac;
  iVar8 = CleanXfac;
  local_78 = this;
  if (this->mInputGridOkay == true) {
    iVar1 = CleanYfac * 0xc;
    iVar5 = CleanYfac * SmallFont->FontHeight;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
              (0x3f4ccccd,screen,0,0,
               (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Height + CleanYfac * -0x3c)
               ,(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width);
    if ((-1 < local_78->InputGridX) && (-1 < local_78->InputGridY)) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f19999a,screen,0xfff8dc,
                 (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Width / 2 +
                              (local_78->InputGridX * iVar8 * 0x12 - (iVar8 * 0xea >> 1))),
                 (ulong)(uint)(local_78->InputGridY * iVar1 + iVar2 * -0x3c +
                              (screen->super_DSimpleCanvas).super_DCanvas.Height));
    }
    local_5c = iVar8 * 9 - (iVar8 * 0xea >> 1);
    local_4c = iVar8 * 0x12;
    local_48 = 0xffffffc1;
    local_70 = 0;
    uVar10 = 0;
    do {
      iVar8 = (iVar1 * (int)uVar10 + iVar2 * -0x36 +
              (screen->super_DSimpleCanvas).super_DCanvas.Height) - iVar5 / 2;
      local_40 = (double)iVar8;
      uVar15 = 0;
      uVar13 = local_5c;
      local_38 = uVar10;
      do {
        uVar10 = local_38;
        local_68 = (ulong)uVar13;
        iVar14 = (screen->super_DSimpleCanvas).super_DCanvas.Width / 2;
        iVar6 = (*SmallFont->_vptr_FFont[2])
                          (SmallFont,
                           (ulong)(uint)(int)"ABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789+-=.,!?@\'\":;[]()<>^#$%&*/_ \b"
                                             [local_70 + uVar15],&local_84);
        range = CR_DARKGRAY;
        if ((uint)local_78->InputGridY == uVar10 && (uint)local_78->InputGridX == uVar15) {
          range = CR_YELLOW;
        }
        pFVar7 = FFont::GetColorTranslation(SmallFont,range);
        font = SmallFont;
        iVar12 = (int)local_68;
        if ((FTexture *)CONCAT44(extraout_var,iVar6) == (FTexture *)0x0) {
          if (local_70 + uVar15 == 0x3e) {
            iVar6 = local_84 * CleanXfac * 3;
            iVar11 = local_84 * CleanXfac * 3 + 3;
            if (-1 < iVar6) {
              iVar11 = iVar6;
            }
            iVar14 = iVar14 - (iVar11 >> 2);
            iVar11 = iVar6 / 2 + iVar14;
            uVar9 = iVar12 + iVar11;
            local_80 = (DFrameBuffer *)
                       CONCAT44(local_80._4_4_,SmallFont->FontHeight * CleanYfac + iVar8);
            iVar6 = (pFVar7->NumEntries * 2) / 3;
            local_54 = (uint)pFVar7->Remap[iVar6];
            local_58 = (anon_union_4_2_12391d7c_for_PalEntry_0)pFVar7->Palette[iVar6].field_0.d;
            local_50 = uVar9;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])();
            uVar13 = local_54;
            aVar4 = local_58;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)(uint)(iVar12 + iVar14),(ulong)local_80 & 0xffffffff,
                       (ulong)uVar9,(ulong)(uint)(CleanYfac + (int)local_80),(ulong)local_54,
                       local_58.d);
            pDVar3 = local_80;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)(uint)(iVar12 + iVar14),(ulong)(uint)(CleanYfac + iVar8),
                       (ulong)(uint)(iVar14 + CleanXfac + iVar12),(ulong)local_80 & 0xffffffff,
                       (ulong)uVar13,aVar4.d);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                      (screen,(ulong)(uint)((iVar11 - CleanXfac) + iVar12),
                       (ulong)(uint)(CleanYfac + iVar8),(ulong)local_50,(ulong)pDVar3 & 0xffffffff,
                       (ulong)uVar13,aVar4.d);
          }
          else if ((uint)((int)local_48 + (int)uVar15) < 2) {
            string = "ED";
            if (local_70 + uVar15 == 0x3f) {
              string = "BS";
            }
            local_80 = screen;
            iVar6 = FFont::StringWidth(SmallFont,string);
            DCanvas::DrawText((DCanvas *)local_80,font,range,
                              (iVar14 - (iVar6 * CleanXfac) / 2) + iVar12,iVar8,(char *)string,
                              0x40001393,1,0);
          }
        }
        else {
          DCanvas::DrawTexture
                    ((DCanvas *)screen,(FTexture *)CONCAT44(extraout_var,iVar6),
                     (double)((iVar14 - (CleanXfac * local_84) / 2) + iVar12),local_40,0x4000138e,
                     pFVar7,0x40001393,1,0);
        }
        uVar15 = uVar15 + 1;
        uVar13 = iVar12 + local_4c;
      } while (uVar15 != 0xd);
      uVar10 = local_38 + 1;
      local_48 = local_48 + 0xd;
      local_70 = local_70 + 0xd;
    } while (uVar10 != 5);
  }
  DMenu::Drawer(&local_78->super_DMenu);
  return;
}

Assistant:

void DTextEnterMenu::Drawer ()
{
	mParentMenu->Drawer();
	if (mInputGridOkay)
	{
		const int cell_width = 18 * CleanXfac;
		const int cell_height = 12 * CleanYfac;
		const int top_padding = cell_height / 2 - SmallFont->GetHeight() * CleanYfac / 2;

		// Darken the background behind the character grid.
		// Unless we frame it with a border, I think it looks better to extend the
		// background across the full width of the screen.
		screen->Dim(0, 0.8f,
			0 /*screen->GetWidth()/2 - 13 * cell_width / 2*/,
			screen->GetHeight() - INPUTGRID_HEIGHT * cell_height,
			screen->GetWidth() /*13 * cell_width*/,
			INPUTGRID_HEIGHT * cell_height);

		if (InputGridX >= 0 && InputGridY >= 0)
		{
			// Highlight the background behind the selected character.
			screen->Dim(MAKERGB(255,248,220), 0.6f,
				InputGridX * cell_width - INPUTGRID_WIDTH * cell_width / 2 + screen->GetWidth() / 2,
				InputGridY * cell_height - INPUTGRID_HEIGHT * cell_height + screen->GetHeight(),
				cell_width, cell_height);
		}

		for (int y = 0; y < INPUTGRID_HEIGHT; ++y)
		{
			const int yy = y * cell_height - INPUTGRID_HEIGHT * cell_height + screen->GetHeight();
			for (int x = 0; x < INPUTGRID_WIDTH; ++x)
			{
				int width;
				const int xx = x * cell_width - INPUTGRID_WIDTH * cell_width / 2 + screen->GetWidth() / 2;
				const int ch = InputGridChars[y * INPUTGRID_WIDTH + x];
				FTexture *pic = SmallFont->GetChar(ch, &width);
				EColorRange color;
				FRemapTable *remap;

				// The highlighted character is yellow; the rest are dark gray.
				color = (x == InputGridX && y == InputGridY) ? CR_YELLOW : CR_DARKGRAY;
				remap = SmallFont->GetColorTranslation(color);

				if (pic != NULL)
				{
					// Draw a normal character.
					screen->DrawTexture(pic, xx + cell_width/2 - width*CleanXfac/2, yy + top_padding,
						DTA_Translation, remap,
						DTA_CleanNoMove, true,
						TAG_DONE);
				}
				else if (ch == ' ')
				{
					// Draw the space as a box outline. We also draw it 50% wider than it really is.
					const int x1 = xx + cell_width/2 - width * CleanXfac * 3 / 4;
					const int x2 = x1 + width * 3 * CleanXfac / 2;
					const int y1 = yy + top_padding;
					const int y2 = y1 + SmallFont->GetHeight() * CleanYfac;
					const int palentry = remap->Remap[remap->NumEntries*2/3];
					const uint32 palcolor = remap->Palette[remap->NumEntries*2/3];
					screen->Clear(x1, y1, x2, y1+CleanYfac, palentry, palcolor);	// top
					screen->Clear(x1, y2, x2, y2+CleanYfac, palentry, palcolor);	// bottom
					screen->Clear(x1, y1+CleanYfac, x1+CleanXfac, y2, palentry, palcolor);	// left
					screen->Clear(x2-CleanXfac, y1+CleanYfac, x2, y2, palentry, palcolor);	// right
				}
				else if (ch == '\b' || ch == 0)
				{
					// Draw the backspace and end "characters".
					const char *const str = ch == '\b' ? "BS" : "ED";
					screen->DrawText(SmallFont, color,
						xx + cell_width/2 - SmallFont->StringWidth(str)*CleanXfac/2,
						yy + top_padding, str, DTA_CleanNoMove, true, TAG_DONE);
				}
			}
		}
	}
	Super::Drawer();
}